

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  double *pdVar1;
  long depth_00;
  ResScalar alpha_00;
  long lhsStride_00;
  double cols_00;
  double *blockB;
  long lVar2;
  undefined8 *puVar3;
  double *pdVar4;
  ulong uVar5;
  ResScalar *pRVar6;
  long lVar7;
  long lVar8;
  ResScalar **ppRVar9;
  size_t __size;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ResScalar *local_f8;
  long local_f0;
  long local_e8;
  ResScalar local_e0;
  long local_d8;
  long local_d0;
  double *local_c8;
  double *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  ResScalar *local_88;
  double local_80;
  long local_78;
  double *local_70;
  double *local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_37;
  gemm_pack_rhs<double,_long,_4,_0,_false,_false> local_36;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_35;
  undefined4 local_34;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gemm_pack_rhs<double,_long,_4,_0,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  
  ppRVar9 = &local_f8;
  local_e0 = alpha;
  local_c0 = _rhs;
  local_a8 = lhsStride;
  local_80 = (double)cols;
  uVar5 = blocking->m_kc;
  local_f0 = rows;
  local_78 = blocking->m_mc;
  if (rows <= blocking->m_mc) {
    local_78 = rows;
  }
  uVar11 = local_78 * uVar5;
  if (uVar11 >> 0x3d == 0) {
    pdVar4 = _lhs;
    if (blocking->m_blockA == (double *)0x0) {
      if (uVar11 < 0x4001) {
        pdVar4 = (double *)((long)&local_f8 - (uVar11 * 8 + 0xf & 0xfffffffffffffff0));
        local_48 = pdVar4;
        local_68 = pdVar4;
        ppRVar9 = (ResScalar **)pdVar4;
      }
      else {
        local_68 = (double *)malloc(uVar11 * 8);
        local_48 = local_68;
        if (local_68 == (double *)0x0) goto LAB_00109901;
      }
    }
    else {
      local_68 = blocking->m_blockA;
      local_48 = (double *)0x0;
      ppRVar9 = &local_f8;
    }
    uVar12 = uVar5 * (long)local_80;
    if (0x1fffffffffffffff < uVar12) {
      ((double *)ppRVar9)[-1] = 5.37445103611754e-318;
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = operator_delete;
      ((double *)ppRVar9)[-1] = 5.37462889975004e-318;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_58 = blocking->m_blockB;
    if (blocking->m_blockB == (double *)0x0) {
      if (uVar12 < 0x4001) {
        pdVar4 = (double *)((long)ppRVar9 - (uVar12 * 8 + 0xf & 0xfffffffffffffff0));
        local_40 = pdVar4;
        local_58 = pdVar4;
        ppRVar9 = (ResScalar **)pdVar4;
      }
      else {
        local_60 = uVar5;
        ((double *)ppRVar9)[-1] = 5.37063190867519e-318;
        local_58 = (double *)malloc(uVar12 * 8);
        local_40 = local_58;
        uVar5 = local_60;
        if (local_58 == (double *)0x0) {
          ((double *)ppRVar9)[-1] = 5.37490557651171e-318;
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = operator_delete;
          ((double *)ppRVar9)[-1] = 5.37508344014422e-318;
          __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
    }
    else {
      local_40 = (double *)0x0;
    }
    if ((uVar5 & 0x1c00000000000000) == 0) {
      local_70 = blocking->m_blockW;
      __size = uVar5 * 0x40;
      local_a0 = uVar11;
      local_98 = uVar12;
      if (local_70 == (double *)0x0) {
        if (__size < 0x20001) {
          ppRVar9 = (ResScalar **)((double *)ppRVar9 + uVar5 * -8);
          local_34 = 0;
          local_50 = (double *)ppRVar9;
          local_70 = (double *)ppRVar9;
        }
        else {
          ((double *)ppRVar9)[-1] = 5.37136312583103e-318;
          local_50 = (double *)malloc(__size);
          if (local_50 == (double *)0x0) {
            ((double *)ppRVar9)[-1] = 5.3751328467088e-318;
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = operator_delete;
            ((double *)ppRVar9)[-1] = (double)&LAB_001099e7;
            __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          local_34 = (int)CONCAT71((int7)((ulong)pdVar4 >> 8),1);
          local_70 = local_50;
        }
      }
      else {
        local_34 = (int)CONCAT71((int7)((ulong)local_70 >> 8),0x20000 < __size);
        local_50 = (double *)0x0;
      }
      pdVar4 = local_68;
      if (0 < depth) {
        local_b0 = uVar5 * local_a8 * 8;
        local_d8 = local_78 * 8;
        local_b8 = depth;
        local_60 = uVar5;
        lVar2 = 0;
        do {
          local_d0 = lVar2 + local_60;
          lVar7 = local_b8;
          if (local_d0 < local_b8) {
            lVar7 = local_d0;
          }
          pdVar1 = local_c0 + lVar2;
          ((double *)ppRVar9)[-2] = 0.0;
          ((double *)ppRVar9)[-1] = 0.0;
          blockB = local_58;
          cols_00 = local_80;
          local_e8 = lVar7 - lVar2;
          ((double *)ppRVar9)[-3] = 5.37218327480313e-318;
          gemm_pack_rhs<double,_long,_4,_0,_false,_false>::operator()
                    (&local_36,blockB,pdVar1,rhsStride,lVar7 - lVar2,(long)cols_00,
                     (long)((double *)ppRVar9)[-2],(long)((double *)ppRVar9)[-1]);
          lVar10 = 0;
          local_c8 = _lhs;
          lVar2 = 0;
          pRVar6 = res;
          lVar7 = local_78;
          while( true ) {
            lVar8 = lVar7;
            if (local_f0 < lVar7) {
              lVar8 = local_f0;
            }
            if (local_f0 <= lVar2) break;
            lVar8 = lVar8 + lVar10;
            ((double *)ppRVar9)[-2] = 0.0;
            ((double *)ppRVar9)[-1] = 0.0;
            lhsStride_00 = local_a8;
            depth_00 = local_e8;
            local_f8 = pRVar6;
            local_88 = (ResScalar *)lVar7;
            local_90 = lVar2;
            ((double *)ppRVar9)[-3] = 5.37276133160876e-318;
            gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                      (&local_37,pdVar4,_lhs,lhsStride_00,depth_00,lVar8,
                       (long)((double *)ppRVar9)[-2],(long)((double *)ppRVar9)[-1]);
            pRVar6 = local_f8;
            local_90 = local_90 + local_78;
            _lhs = (double *)((long)_lhs + local_d8);
            lVar7 = (long)local_88 + local_78;
            lVar10 = lVar10 - local_78;
            local_88 = (ResScalar *)((long)local_f8 + local_d8);
            ((double *)ppRVar9)[-2] = (double)local_70;
            ((double *)ppRVar9)[-4] = 0.0;
            ((double *)ppRVar9)[-3] = 0.0;
            ((double *)ppRVar9)[-5] = -NAN;
            ((double *)ppRVar9)[-6] = -NAN;
            ((double *)ppRVar9)[-7] = local_80;
            ((double *)ppRVar9)[-8] = (double)depth_00;
            pdVar1 = local_58;
            alpha_00 = local_e0;
            ((double *)ppRVar9)[-9] = 5.37347772679523e-318;
            gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                      (&local_35,pRVar6,resStride,pdVar4,pdVar1,lVar8,(long)((double *)ppRVar9)[-8],
                       (long)((double *)ppRVar9)[-7],alpha_00,(long)((double *)ppRVar9)[-6],
                       (long)((double *)ppRVar9)[-5],(long)((double *)ppRVar9)[-4],
                       (long)((double *)ppRVar9)[-3],(double *)((double *)ppRVar9)[-2]);
            lVar2 = local_90;
            pRVar6 = local_88;
          }
          _lhs = (double *)((long)local_c8 + local_b0);
          lVar2 = local_d0;
        } while (local_d0 < local_b8);
      }
      pdVar4 = local_50;
      if ((char)local_34 != '\0') {
        ((double *)ppRVar9)[-1] = 5.37386803865545e-318;
        free(pdVar4);
      }
      pdVar4 = local_40;
      uVar5 = local_a0;
      if (0x4000 < local_98) {
        ((double *)ppRVar9)[-1] = 5.37401131769274e-318;
        free(pdVar4);
      }
      pdVar4 = local_48;
      if (0x4000 < uVar5) {
        ((double *)ppRVar9)[-1] = 5.37410024950899e-318;
        free(pdVar4);
      }
      return;
    }
    ((double *)ppRVar9)[-1] = 5.37467830631463e-318;
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = operator_delete;
    ((double *)ppRVar9)[-1] = 5.37485616994713e-318;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
LAB_00109901:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = operator_delete;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
  const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  //Index nc = blocking.nc(); // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    Index tid = omp_get_thread_num();
    Index threads = omp_get_num_threads();
    
    std::size_t sizeA = kc*mc;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, w, sizeW, 0);
    
    RhsScalar* blockB = blocking.blockB();
    eigen_internal_assert(blockB!=0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing A'.
      pack_lhs(blockA, &lhs(0,k), lhsStride, actual_kc, mc);

      // Pack B_k to B' in a parallel fashion:
      // each thread packs the sub block B_k,j to B'_j where j is the thread id.

      // However, before copying to B'_j, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_rhs(blockB+info[tid].rhs_start*actual_kc, &rhs(k,info[tid].rhs_start), rhsStride, actual_kc, info[tid].rhs_length);

      // Notify the other threads that the part B'_j is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per B'_j
      for(Index shift=0; shift<threads; ++shift)
      {
        Index j = (tid+shift)%threads;

        // At this point we have to make sure that B'_j has been updated by the thread j,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if(shift>0)
          while(info[j].sync!=k) {}

        gebp(res+info[j].rhs_start*resStride, resStride, blockA, blockB+info[j].rhs_start*actual_kc, mc, actual_kc, info[j].rhs_length, alpha, -1,-1,0,0, w);
      }

      // Then keep going as usual with the remaining A'
      for(Index i=mc; i<rows; i+=mc)
      {
        const Index actual_mc = (std::min)(i+mc,rows)-i;

        // pack A_i,k to A'
        pack_lhs(blockA, &lhs(i,k), lhsStride, actual_kc, actual_mc);

        // C_i += A' * B'
        gebp(res+i, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1,-1,0,0, w);
      }

      // Release all the sub blocks B'_j of B' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index j=0; j<threads; ++j)
      {
        #pragma omp atomic
        info[j].users -= 1;
      }
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockW, sizeW, blocking.blockW());

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    // (==GEMM_VAR1)
    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
      // => Pack rhs's panel into a sequential chunk of memory (L2 caching)
      // Note that this panel will be read as many times as the number of blocks in the lhs's
      // vertical panel which is, in practice, a very low number.
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, cols);

      // For each mc x kc block of the lhs's vertical panel...
      // (==GEPP_VAR1)
      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,rows)-i2;

        // We pack the lhs's block into a sequential chunk of memory (L1 caching)
        // Note that this block will be read a very high number of times, which is equal to the number of
        // micro vertical panel of the large rhs's panel (e.g., cols/4 times).
        pack_lhs(blockA, &lhs(i2,k2), lhsStride, actual_kc, actual_mc);

        // Everything is packed, we can now call the block * panel kernel:
        gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1, -1, 0, 0, blockW);
      }
    }
  }
}